

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char[4],int,char,std::__cxx11::string,std::__cxx11::string>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [4],int *args_4,char *args_5,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_150 [32];
  cmAlphaNum local_130;
  undefined8 local_100;
  char *local_f8;
  char local_f0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  size_t local_c0;
  char *pcStack_b8;
  size_type local_b0;
  pointer local_a8;
  undefined8 local_a0;
  char *local_98;
  size_type local_90;
  pointer local_88;
  size_t local_80;
  char (*local_78) [4];
  size_t local_70;
  char *pcStack_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  size_type local_40;
  pointer local_38;
  
  local_d0._M_len = (a->View_)._M_len;
  local_d0._M_str = (a->View_)._M_str;
  local_c0 = (b->View_)._M_len;
  pcStack_b8 = (b->View_)._M_str;
  local_a8 = (args->_M_dataplus)._M_p;
  local_b0 = args->_M_string_length;
  local_f0[0] = *args_1;
  local_f8 = local_f0;
  local_100 = 1;
  local_a0 = 1;
  local_88 = (args_2->_M_dataplus)._M_p;
  local_90 = args_2->_M_string_length;
  local_98 = local_f8;
  local_80 = strlen(*args_3);
  local_78 = args_3;
  cmAlphaNum::cmAlphaNum(&local_130,*args_4);
  local_70 = local_130.View_._M_len;
  pcStack_68 = local_130.View_._M_str;
  local_150[0] = *args_5;
  local_58 = local_150;
  local_60 = 1;
  local_48 = (args_6->_M_dataplus)._M_p;
  local_50 = args_6->_M_string_length;
  local_38 = (args_7->_M_dataplus)._M_p;
  local_40 = args_7->_M_string_length;
  views._M_len = 10;
  views._M_array = &local_d0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}